

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t midr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  
  iVar2 = arm_current_el(env);
  _Var1 = arm_is_secure(env);
  if ((((env->features & 0x100000000) != 0) && (!_Var1)) && (iVar2 == 1)) {
    return (env->cp15).vpidr_el2;
  }
  uVar3 = raw_read(env,ri);
  return uVar3;
}

Assistant:

static uint64_t midr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    ARMCPU *cpu = env_archcpu(env);
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);

    if (arm_feature(&cpu->env, ARM_FEATURE_EL2) && !secure && cur_el == 1) {
        return env->cp15.vpidr_el2;
    }
    return raw_read(env, ri);
}